

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_epoch(ggml_opt_context_t opt_ctx,ggml_opt_dataset_t dataset,
                   ggml_opt_result_t result_train,ggml_opt_result_t result_eval,int64_t idata_split,
                   ggml_opt_epoch_callback callback_train,ggml_opt_epoch_callback callback_eval)

{
  ggml_tensor *data_batch;
  ggml_tensor *labels_batch;
  ggml_tensor *ibatch_00;
  long lVar1;
  long lVar2;
  ggml_opt_result *pgVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ggml_opt_dataset_t in_RSI;
  ggml_opt_context_t in_RDI;
  ggml_opt_context_t in_R8;
  ggml_opt_dataset_t in_R9;
  code *in_stack_00000008;
  int64_t t_loop_start;
  int64_t ibatch;
  int64_t ibatch_split;
  int64_t nbatches;
  int64_t ndata_batch;
  int64_t ndata;
  ggml_tensor *data;
  ggml_tensor *labels;
  ggml_tensor *inputs;
  ggml_opt_result *in_stack_ffffffffffffff78;
  long local_70;
  
  data_batch = ggml_opt_inputs(in_RDI);
  labels_batch = ggml_opt_labels(in_RDI);
  ibatch_00 = ggml_opt_dataset_data(in_RSI);
  if (ibatch_00->ne[0] != data_batch->ne[0]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
               ,0x2b0,"GGML_ASSERT(%s) failed","data->ne[0] == inputs->ne[0]");
  }
  lVar2 = data_batch->ne[1];
  if (ibatch_00->ne[1] % data_batch->ne[1] == 0) {
    lVar1 = (long)ibatch_00->ne[1] / lVar2;
    if ((long)in_R8 < 0) {
      in_R8 = (ggml_opt_context_t)ibatch_00->ne[1];
    }
    if ((long)in_R8 % lVar2 == 0) {
      lVar2 = (long)in_R8 / lVar2;
      local_70 = 0;
      pgVar3 = (ggml_opt_result *)ggml_time_us();
      for (; local_70 < lVar2; local_70 = local_70 + 1) {
        ggml_opt_dataset_get_batch(in_R9,data_batch,labels_batch,(int64_t)ibatch_00);
        ggml_opt_forward_backward(in_R8,in_stack_ffffffffffffff78);
        if (in_R9 != (ggml_opt_dataset_t)0x0) {
          in_stack_ffffffffffffff78 = pgVar3;
          (*(code *)in_R9)(1,in_RDI,in_RSI,in_RDX,local_70 + 1,lVar2);
        }
      }
      pgVar3 = (ggml_opt_result *)ggml_time_us();
      for (; local_70 < lVar1; local_70 = local_70 + 1) {
        ggml_opt_dataset_get_batch(in_R9,data_batch,labels_batch,(int64_t)ibatch_00);
        ggml_opt_forward(in_R8,in_stack_ffffffffffffff78);
        if (in_stack_00000008 != (code *)0x0) {
          in_stack_ffffffffffffff78 = pgVar3;
          (*in_stack_00000008)(0,in_RDI,in_RSI,in_RCX,(local_70 + 1) - lVar2,lVar1 - lVar2);
        }
      }
      return;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
               ,0x2b9,"GGML_ASSERT(%s) failed","idata_split % ndata_batch == 0");
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
             ,0x2b5,"GGML_ASSERT(%s) failed","data->ne[1] % inputs->ne[1] == 0");
}

Assistant:

void ggml_opt_epoch(
        ggml_opt_context_t      opt_ctx,
        ggml_opt_dataset_t      dataset,
        ggml_opt_result_t       result_train,
        ggml_opt_result_t       result_eval,
        int64_t                 idata_split,
        ggml_opt_epoch_callback callback_train,
        ggml_opt_epoch_callback callback_eval) {
    struct ggml_tensor * inputs = ggml_opt_inputs(opt_ctx);
    struct ggml_tensor * labels = ggml_opt_labels(opt_ctx);
    struct ggml_tensor * data   = ggml_opt_dataset_data(dataset);
    GGML_ASSERT(data->ne[0] == inputs->ne[0]);

    const int64_t ndata       =   data->ne[1];
    const int64_t ndata_batch = inputs->ne[1];

    GGML_ASSERT(data->ne[1] % inputs->ne[1] == 0);
    const int64_t nbatches = ndata/ndata_batch;

    idata_split = idata_split < 0 ? ndata : idata_split;
    GGML_ASSERT(idata_split % ndata_batch == 0);
    const int64_t ibatch_split = idata_split / ndata_batch;

    int64_t ibatch = 0;
    int64_t t_loop_start = ggml_time_us();
    for (; ibatch < ibatch_split; ++ibatch) {
        ggml_opt_dataset_get_batch(dataset, inputs, labels, ibatch);
        ggml_opt_forward_backward(opt_ctx, result_train);
        if (callback_train) {
            callback_train(true, opt_ctx, dataset, result_train, ibatch+1, ibatch_split, t_loop_start);
        }
    }
    t_loop_start = ggml_time_us();
    for (; ibatch < nbatches; ++ibatch) {
        ggml_opt_dataset_get_batch(dataset, inputs, labels, ibatch);
        ggml_opt_forward(opt_ctx, result_eval);
        if (callback_eval) {
            callback_eval(false, opt_ctx, dataset, result_eval, ibatch+1-ibatch_split, nbatches-ibatch_split, t_loop_start);
        }
    }
}